

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,acsdefered_t *defer,acsdefered_t *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = FSerializer::Enum<acsdefered_t::EType>(arc,"type",&defer->type);
    pFVar2 = FSerializer::ScriptNum(pFVar2,"script",&defer->script);
    pFVar2 = FSerializer::Array<int>(pFVar2,"args",defer->args,3,false);
    pFVar2 = FSerializer::operator()(pFVar2,"player",&defer->playernum);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, acsdefered_t &defer, acsdefered_t *def)
{
	if (arc.BeginObject(key))
	{
		arc.Enum("type", defer.type)
			.ScriptNum("script", defer.script)
			.Array("args", defer.args, 3)
			("player", defer.playernum)
			.EndObject();
	}
	return arc;
}